

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

void __thiscall CRegexParser::~CRegexParser(CRegexParser *this)

{
  long in_RDI;
  
  reset(this);
  if (*(long *)(in_RDI + 8) != 0) {
    free(*(void **)(in_RDI + 8));
    *(undefined8 *)(in_RDI + 8) = 0;
  }
  if (*(long *)(in_RDI + 0x18) != 0) {
    free(*(void **)(in_RDI + 0x18));
    *(undefined8 *)(in_RDI + 0x18) = 0;
  }
  return;
}

Assistant:

CRegexParser::~CRegexParser()
{
    /* reset state (to delete most of our memory structures) */
    reset();
    
    /* if we've allocated an array, delete it */
    if (tuple_arr_ != 0)
    {
        t3free(tuple_arr_);
        tuple_arr_ = 0;
    }

    /* delete our range buffer if we have one */
    if (range_buf_ != 0)
    {
        t3free(range_buf_);
        range_buf_ = 0;
    }
}